

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  copyable *pcVar6;
  string *psVar7;
  bar_base *pbVar8;
  char *__lhs;
  runtime_error *prVar9;
  _Self __tmp_1;
  _Self __tmp;
  allocator local_249;
  scope sc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator local_209;
  callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_208;
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  cb;
  service srv;
  value params;
  allocator local_1c9;
  ostringstream oss;
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_48;
  string path;
  
  if (argc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage plugin_test /path/to/the/plugin/dir");
    std::endl<char,std::char_traits<char>>(poVar3);
    return 1;
  }
  std::__cxx11::string::string((string *)&path,argv[1],(allocator *)&oss);
  cppcms::json::value::copyable::copyable(&params.d);
  cppcms::json::value::value<std::__cxx11::string>((value *)&srv,&path);
  std::__cxx11::string::string((string *)&oss,"plugin",(allocator *)&sc);
  psVar4 = (string *)cppcms::json::value::operator[]((string *)&params);
  std::__cxx11::string::string((string *)&names,"paths",(allocator *)&cb);
  uVar5 = cppcms::json::value::operator[](psVar4);
  pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
  cppcms::json::value::copyable::operator=(pcVar6,(copyable *)&srv);
  std::__cxx11::string::~string((string *)&names);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable((copyable *)&srv);
  cppcms::json::value::value<char[7]>((value *)&srv,(char (*) [7])"plugin");
  std::__cxx11::string::string((string *)&oss,"plugin",(allocator *)&sc);
  psVar4 = (string *)cppcms::json::value::operator[]((string *)&params);
  std::__cxx11::string::string((string *)&names,"modules",(allocator *)&cb);
  uVar5 = cppcms::json::value::operator[](psVar4);
  pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
  cppcms::json::value::copyable::operator=(pcVar6,(copyable *)&srv);
  std::__cxx11::string::~string((string *)&names);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable((copyable *)&srv);
  cppcms::plugin::scope::scope(&sc,&params);
  std::__cxx11::string::string((string *)&oss,"plugin",(allocator *)&names);
  cVar1 = cppcms::plugin::scope::is_loaded_by_this_scope((string *)&sc);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x1a);
    std::operator<<(poVar3," sc.is_loaded_by_this_scope(\"plugin\")");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&names);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"plugin",(allocator *)&names);
  cVar1 = cppcms::plugin::scope::is_loaded((string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x1b);
    std::operator<<(poVar3," cppcms::plugin::scope::is_loaded(\"plugin\")");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&names);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"- Normal call");
  std::endl<char,std::char_traits<char>>(poVar3);
  cb.call_ptr.p_ =
       (pointer_type)
       (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)0x0;
  psVar7 = (string *)cppcms::plugin::manager::instance();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&local_208);
  std::__cxx11::string::string((string *)&names,"lower",&local_249);
  cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string_const&)>
            ((manager *)&srv,psVar7,(string *)&oss);
  booster::
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::operator=(&cb.call_ptr,
              (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
               *)&srv);
  booster::
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)&srv);
  std::__cxx11::string::~string((string *)&names);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&names,"Hello World",(allocator *)&srv);
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,&cb,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&names);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "hello world");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&names);
  if (bVar2) {
    psVar7 = (string *)cppcms::plugin::manager::instance();
    std::__cxx11::string::string((string *)&oss,"foo",&local_249);
    std::__cxx11::string::string((string *)&names,"bar::create",&local_209);
    cppcms::plugin::manager::entry<bar_base*(std::__cxx11::string_const&)>
              ((manager *)&local_208,psVar7,(string *)&oss);
    std::__cxx11::string::string((string *)&srv,"hello",&local_1c9);
    pbVar8 = booster::
             callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(&local_208,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srv)
    ;
    std::__cxx11::string::~string((string *)&srv);
    booster::
    intrusive_ptr<booster::callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~intrusive_ptr(&local_208.call_ptr);
    std::__cxx11::string::~string((string *)&names);
    std::__cxx11::string::~string((string *)&oss);
    __lhs = (char *)(*(code *)**(undefined8 **)pbVar8)(pbVar8);
    std::__cxx11::string::string((string *)&oss,"hello",(allocator *)&names);
    bVar2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    if (bVar2) {
      (**(code **)(*(long *)pbVar8 + 0x10))(pbVar8);
      poVar3 = std::operator<<((ostream *)&std::cout,"- Bad signature");
      std::endl<char,std::char_traits<char>>(poVar3);
      psVar7 = (string *)cppcms::plugin::manager::instance();
      std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&srv);
      std::__cxx11::string::string((string *)&names,"lower",(allocator *)&local_208);
      cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string&)>
                ((manager *)&local_48,psVar7,(string *)&oss);
      booster::
      intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::~intrusive_ptr(&local_48);
      std::__cxx11::string::~string((string *)&names);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x27);
      std::operator<<(poVar3," !\"Never Get There\"");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&names);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22);
    std::operator<<(poVar3," b->msg() == std::string(\"hello\")");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&names);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x20);
  std::operator<<(poVar3," cb(\"Hello World\")==\"hello world\"");
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,(string *)&names);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc,char **argv)
{
	if(argc!=2) {
		std::cerr << "Usage plugin_test /path/to/the/plugin/dir" << std::endl;
		return 1;
	}
	std::string path = argv[1];
	cppcms::json::value params;

	params["plugin"]["paths"][0]=path;
	params["plugin"]["modules"][0]="plugin";

	try {
		using cppcms::plugin::manager;
		{
			cppcms::plugin::scope sc(params);
			TEST(sc.is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));

			std::cout << "- Normal call" << std::endl;
			booster::callback<std::string(std::string const &)> cb;
			cb = manager::instance().entry<std::string(std::string const &)>("foo","lower");
			TEST(cb("Hello World")=="hello world");
			bar_base *b=manager::instance().entry<bar_base *(std::string const &)>("foo","bar::create")("hello");
			TEST(b->msg() == std::string("hello"));
			delete b;
			try {
				std::cout << "- Bad signature" << std::endl;
				manager::instance().entry<std::string(std::string &)>("foo","lower");
				TEST(!"Never Get There");
			}
			catch(cppcms::plugin::signature_error const &e) {
				std::string msg = e.what();
				TEST(msg.find("std::string(std::string const &)")!=std::string::npos);
			}
			catch(...) { throw std::runtime_error("Something else thrown"); }
			std::cout << "- Iteration" << std::endl;
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().plugins().size()==1);
			TEST(*manager::instance().plugins().begin()=="foo");
			TEST(manager::instance().entries("foo").size()==3);
			std::set<std::string> names = manager::instance().entries("foo");
			std::set<std::string>::iterator p=names.begin();
			TEST(*p++ == "bar::create");
			TEST(*p++ == "counter");
			TEST(*p++ == "lower");
			TEST(p==names.end());
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
		} 
		std::cout << "- Unload" << std::endl;
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
		try {
			manager::instance().entry<std::string(std::string const &)>("foo","lower");
			std::cerr << "Must Not get there:" << __LINE__<<std::endl;
			return 1;
		}
		catch(cppcms::cppcms_error const &) {}
		catch(...) { throw std::runtime_error("Something else thrown"); }
		TEST(cppcms::plugin::manager::instance().has_plugin("foo")==false);
		std::cout << "- Scope vs Service" << std::endl;
		{
			cppcms::service srv(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(srv.plugins().is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::plugin::scope sc(params);
				TEST(!sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		{
			cppcms::plugin::scope sc(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::service srv(params);
				TEST(!srv.plugins().is_loaded_by_this_scope("plugin"));
				TEST(sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		TEST(!manager::instance().has_plugin("foo"));
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
	}
	catch(std::exception const &e) {
		std::cerr << "Error:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}